

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O3

void mpiabi_fetch_and_op_
               (void *origin_addr,void *result_addr,MPIABI_Fint *datatype,MPIABI_Fint *target_rank,
               MPIABI_Fint *target_disp,MPIABI_Fint *op,MPIABI_Fint *win,MPIABI_Fint *ierror)

{
  mpi_fetch_and_op_();
  return;
}

Assistant:

void mpiabi_fetch_and_op_(
  const void * origin_addr,
  void * result_addr,
  const MPIABI_Fint * datatype,
  const MPIABI_Fint * target_rank,
  const MPIABI_Fint * target_disp,
  const MPIABI_Fint * op,
  const MPIABI_Fint * win,
  MPIABI_Fint * ierror
) {
  return mpi_fetch_and_op_(
    origin_addr,
    result_addr,
    datatype,
    target_rank,
    target_disp,
    op,
    win,
    ierror
  );
}